

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# munkres.hxx
# Opt level: O0

IndexPair __thiscall
markurem::matching::
Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>
::find_zero(Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>
            *this,Index start_row)

{
  const_reference cVar1;
  bool bVar2;
  pointer pAVar3;
  Value VVar4;
  long in_RSI;
  size_type in_RDI;
  Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>
  *this_00;
  double extraout_XMM0_Qa;
  double dVar5;
  AdjacencyIterator it;
  Index row;
  Index idx;
  size_type *n_rows;
  Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_> *in_stack_ffffffffffffff88;
  ulong _row;
  Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>
  *in_stack_ffffffffffffff90;
  AdjacencyIterator in_stack_ffffffffffffffb0;
  __normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
  local_48;
  ulong local_40;
  ulong local_38;
  size_type local_30;
  ulong *local_28;
  long local_20;
  IndexPair local_10;
  
  local_20 = in_RSI;
  local_30 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x18));
  local_28 = &local_30;
  local_38 = 0;
  do {
    if (*local_28 <= local_38) {
      IndexPair::IndexPair(&local_10,0xffffffffffffffff,0xffffffffffffffff);
      return local_10;
    }
    local_40 = local_20 + local_38;
    if (*local_28 <= local_40) {
      local_20 = -local_40;
      local_40 = 0;
    }
    cVar1 = std::vector<bool,_std::allocator<bool>_>::operator[]
                      ((vector<bool,_std::allocator<bool>_> *)in_stack_ffffffffffffffb0._M_current,
                       in_RDI);
    if (!cVar1) {
      local_48._M_current =
           (Adjacency<unsigned_long> *)
           andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::
           adjacenciesFromVertexBegin(in_stack_ffffffffffffff88,0x1d050f);
      while( true ) {
        in_stack_ffffffffffffffb0 =
             andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::
             adjacenciesFromVertexEnd(in_stack_ffffffffffffff88,0x1d0526);
        bVar2 = __gnu_cxx::operator!=
                          ((__normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
                            *)in_stack_ffffffffffffff90,
                           (__normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
                            *)in_stack_ffffffffffffff88);
        if (!bVar2) break;
        pAVar3 = __gnu_cxx::
                 __normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
                 ::operator->(&local_48);
        andres::graph::Adjacency<unsigned_long>::vertex(pAVar3);
        col_of_idx(in_stack_ffffffffffffff90,(size_t)in_stack_ffffffffffffff88);
        cVar1 = std::vector<bool,_std::allocator<bool>_>::operator[]
                          ((vector<bool,_std::allocator<bool>_> *)
                           in_stack_ffffffffffffffb0._M_current,in_RDI);
        if (!cVar1) {
          this_00 = *(Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>
                      **)(in_RDI + 8);
          pAVar3 = __gnu_cxx::
                   __normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
                   ::operator->(&local_48);
          VVar4 = andres::graph::Adjacency<unsigned_long>::edge(pAVar3);
          in_stack_ffffffffffffff90 = this_00;
          std::vector<double,_std::allocator<double>_>::operator[]
                    ((vector<double,_std::allocator<double>_> *)this_00,VVar4);
          std::abs((int)this_00);
          dVar5 = std::numeric_limits<double>::epsilon();
          if (extraout_XMM0_Qa < dVar5) {
            _row = local_40;
            pAVar3 = __gnu_cxx::
                     __normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
                     ::operator->(&local_48);
            VVar4 = andres::graph::Adjacency<unsigned_long>::vertex(pAVar3);
            IndexPair::IndexPair(&local_10,_row,VVar4);
            return local_10;
          }
        }
        __gnu_cxx::
        __normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
        ::operator++(&local_48);
      }
    }
    local_38 = local_38 + 1;
  } while( true );
}

Assistant:

typename Matching<GRAPH, COST, MASK>::IndexPair
Matching<GRAPH, COST, MASK>::find_zero(Index start_row) const
{
    auto const& n_rows = rows_.size();
    for (Index idx = 0; idx < n_rows; ++idx) {

        // start from start_row, and wrap around at n_rows.
        auto row = start_row + idx;
        if (row >= n_rows) {
            start_row = -row;
            row = 0;
        }

        if (row_cover[row])
            continue;

        for (auto it = graph_.adjacenciesFromVertexBegin(row);
             it != graph_.adjacenciesFromVertexEnd(row); ++it) {
            if (!col_cover[col_of_idx(it->vertex())] &&
                std::abs(costs_[it->edge()]) <
                    std::numeric_limits<value_type>::epsilon())
                return { row, it->vertex() };
        }
    }

    return { IDXMAX, IDXMAX };
}